

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluStrUtil.cpp
# Opt level: O3

ostream * glu::operator<<(ostream *str,ContextType contextType)

{
  ContextFlags CVar1;
  char *__s;
  size_t sVar2;
  ContextFlags CVar3;
  char **ppcVar4;
  ulong uVar5;
  ContextFlags CVar6;
  Hex<8UL> local_38;
  
  operator<<(str,contextType.super_ApiType.m_bits & 0x3ff);
  CVar6 = (uint)contextType.super_ApiType.m_bits >> 10 &
          (CONTEXT_FORWARD_COMPATIBLE|CONTEXT_DEBUG|CONTEXT_ROBUST);
  if (CVar6 != 0) {
    std::__ostream_insert<char,std::char_traits<char>>(str," (",2);
    ppcVar4 = &operator<<::s_descs[0].desc;
    uVar5 = 0;
    CVar3 = CVar6;
    do {
      CVar1 = ((anon_struct_16_2_3f1b513e *)(ppcVar4 + -1))->flag;
      if ((CVar1 & CVar3) != 0) {
        if (CVar3 != CVar6) {
          std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
        }
        __s = *ppcVar4;
        if (__s == (char *)0x0) {
          std::ios::clear((int)str + (int)*(undefined8 *)(*(long *)str + -0x18));
        }
        else {
          sVar2 = strlen(__s);
          std::__ostream_insert<char,std::char_traits<char>>(str,__s,sVar2);
        }
        CVar3 = CVar3 & ~CVar1;
      }
      if (1 < uVar5) break;
      uVar5 = uVar5 + 1;
      ppcVar4 = ppcVar4 + 2;
    } while (CVar3 != 0);
    if (CVar3 != 0) {
      if (CVar3 != CVar6) {
        std::__ostream_insert<char,std::char_traits<char>>(str,", ",2);
      }
      local_38.value = (deUint64)CVar3;
      tcu::Format::Hex<8UL>::toStream(&local_38,str);
    }
    std::__ostream_insert<char,std::char_traits<char>>(str,")",1);
  }
  return str;
}

Assistant:

std::ostream& operator<< (std::ostream& str, ContextType contextType)
{
	str << contextType.getAPI();

	if (contextType.getFlags() != ContextFlags(0))
	{
		static const struct
		{
			ContextFlags	flag;
			const char*		desc;
		} s_descs[] =
		{
			{ CONTEXT_DEBUG,				"debug"					},
			{ CONTEXT_FORWARD_COMPATIBLE,	"forward-compatible"	},
			{ CONTEXT_ROBUST,				"robust"				}
		};
		ContextFlags	flags	= contextType.getFlags();

		str << " (";

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(s_descs) && flags != 0; ndx++)
		{
			if ((flags & s_descs[ndx].flag) != 0)
			{
				if (flags != contextType.getFlags())
					str << ", ";

				str << s_descs[ndx].desc;
				flags = flags & ~s_descs[ndx].flag;
			}
		}

		if (flags != 0)
		{
			// Unresolved
			if (flags != contextType.getFlags())
				str << ", ";
			str << tcu::toHex(flags);
		}

		str << ")";
	}

	return str;
}